

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O3

void __thiscall
dynet::NaryTreeLSTMBuilder::new_graph_impl
          (NaryTreeLSTMBuilder *this,ComputationGraph *cg,bool update)

{
  pointer pvVar1;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *pvVar2;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *pvVar3;
  pointer pvVar4;
  Parameter p_00;
  ComputationGraph *g;
  LookupParameterStorage *pLVar5;
  undefined7 in_register_00000011;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *this_00;
  pointer pvVar6;
  uint k;
  ulong uVar7;
  long lVar8;
  initializer_list<dynet::Expression> __l;
  Expression EVar9;
  LookupParameter p;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vals;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  lvars;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vars;
  allocator_type local_185;
  undefined4 local_184;
  ComputationGraph *local_180;
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  *local_178;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_170;
  undefined8 local_168;
  ComputationGraph *local_160;
  undefined8 local_158;
  ComputationGraph *local_150;
  undefined8 local_148;
  ComputationGraph *local_140;
  undefined8 local_138;
  ComputationGraph *local_130;
  undefined8 local_128;
  ComputationGraph *local_120;
  undefined8 local_118;
  ComputationGraph *local_110;
  pointer local_108;
  ComputationGraph *local_100;
  NaryTreeLSTMBuilder *local_f8;
  ulong local_f0;
  LookupParameter local_e8;
  void *local_e0 [3];
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  local_c8;
  undefined8 local_b0;
  ComputationGraph *local_a8;
  undefined8 local_a0;
  ComputationGraph *local_98;
  undefined8 local_90;
  ComputationGraph *local_88;
  undefined8 local_80;
  ComputationGraph *local_78;
  undefined8 local_70;
  ComputationGraph *local_68;
  undefined8 local_60;
  Expression local_58;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_48;
  
  local_184 = (undefined4)CONCAT71(in_register_00000011,update);
  this->cg = cg;
  local_170 = &this->param_vars;
  local_180 = cg;
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear(local_170);
  local_178 = &this->lparam_vars;
  pvVar2 = (this->lparam_vars).
           super__Vector_base<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->lparam_vars).
           super__Vector_base<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pvVar2;
  if (pvVar3 != pvVar2) {
    do {
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::~vector(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pvVar3);
    (this->lparam_vars).
    super__Vector_base<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  }
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::reserve(local_170,(ulong)this->layers);
  std::
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  ::reserve(local_178,(ulong)this->layers);
  if (this->layers != 0) {
    local_f0 = 0;
    local_f8 = this;
    do {
      g = local_180;
      pvVar4 = (this->params).
               super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar1 = pvVar4 + local_f0;
      pvVar6 = (this->lparams).
               super__Vector_base<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_f0;
      p_00.p = (ParameterStorage *)
               *pvVar4[local_f0].
                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((char)local_184 == '\0') {
        EVar9 = const_parameter(local_180,p_00);
        local_108 = EVar9._8_8_;
        local_100 = EVar9.pg;
        EVar9 = const_parameter(g,*(ParameterStorage **)
                                   (*(long *)&(pvVar1->
                                              super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                              )._M_impl.super__Vector_impl_data + 8));
        local_118 = EVar9._8_8_;
        local_110 = EVar9.pg;
        EVar9 = const_parameter(g,*(ParameterStorage **)
                                   (*(long *)&(pvVar1->
                                              super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                              )._M_impl.super__Vector_impl_data + 0x10));
        local_128 = EVar9._8_8_;
        local_120 = EVar9.pg;
        EVar9 = const_parameter(g,*(ParameterStorage **)
                                   (*(long *)&(pvVar1->
                                              super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                              )._M_impl.super__Vector_impl_data + 0x18));
        local_138 = EVar9._8_8_;
        local_130 = EVar9.pg;
        EVar9 = const_parameter(g,*(ParameterStorage **)
                                   (*(long *)&(pvVar1->
                                              super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                              )._M_impl.super__Vector_impl_data + 0x20));
        local_148 = EVar9._8_8_;
        local_140 = EVar9.pg;
        EVar9 = const_parameter(g,*(ParameterStorage **)
                                   (*(long *)&(pvVar1->
                                              super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                              )._M_impl.super__Vector_impl_data + 0x28));
        local_158 = EVar9._8_8_;
        local_150 = EVar9.pg;
        EVar9 = const_parameter(g,*(ParameterStorage **)
                                   (*(long *)&(pvVar1->
                                              super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                              )._M_impl.super__Vector_impl_data + 0x30));
        local_168 = EVar9._8_8_;
        local_160 = EVar9.pg;
        local_58 = const_parameter(g,*(ParameterStorage **)
                                      (*(long *)&(pvVar1->
                                                 super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                 )._M_impl.super__Vector_impl_data + 0x38));
      }
      else {
        EVar9 = parameter(local_180,p_00);
        local_108 = EVar9._8_8_;
        local_100 = EVar9.pg;
        EVar9 = parameter(g,*(ParameterStorage **)
                             (*(long *)&(pvVar1->
                                        super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                        )._M_impl.super__Vector_impl_data + 8));
        local_118 = EVar9._8_8_;
        local_110 = EVar9.pg;
        EVar9 = parameter(g,*(ParameterStorage **)
                             (*(long *)&(pvVar1->
                                        super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                        )._M_impl.super__Vector_impl_data + 0x10));
        local_128 = EVar9._8_8_;
        local_120 = EVar9.pg;
        EVar9 = parameter(g,*(ParameterStorage **)
                             (*(long *)&(pvVar1->
                                        super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                        )._M_impl.super__Vector_impl_data + 0x18));
        local_138 = EVar9._8_8_;
        local_130 = EVar9.pg;
        EVar9 = parameter(g,*(ParameterStorage **)
                             (*(long *)&(pvVar1->
                                        super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                        )._M_impl.super__Vector_impl_data + 0x20));
        local_148 = EVar9._8_8_;
        local_140 = EVar9.pg;
        EVar9 = parameter(g,*(ParameterStorage **)
                             (*(long *)&(pvVar1->
                                        super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                        )._M_impl.super__Vector_impl_data + 0x28));
        local_158 = EVar9._8_8_;
        local_150 = EVar9.pg;
        EVar9 = parameter(g,*(ParameterStorage **)
                             (*(long *)&(pvVar1->
                                        super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                        )._M_impl.super__Vector_impl_data + 0x30));
        local_168 = EVar9._8_8_;
        local_160 = EVar9.pg;
        local_58 = parameter(g,*(ParameterStorage **)
                                (*(long *)&(pvVar1->
                                           super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                           )._M_impl.super__Vector_impl_data + 0x38));
      }
      local_c8.
      super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_100;
      local_c8.
      super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_108;
      local_c8.
      super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_110;
      local_b0 = local_118;
      local_a8 = local_120;
      local_a0 = local_128;
      local_98 = local_130;
      local_90 = local_138;
      local_88 = local_140;
      local_80 = local_148;
      local_78 = local_150;
      local_70 = local_158;
      local_68 = local_160;
      local_60 = local_168;
      __l._M_len = 8;
      __l._M_array = (iterator)&local_c8;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (&local_48,__l,(allocator_type *)local_e0);
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::push_back(local_170,&local_48);
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::vector(&local_c8,
               (long)*(pointer *)
                      ((long)&(pvVar6->
                              super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                              )._M_impl.super__Vector_impl_data + 8) -
               *(long *)&(pvVar6->
                         super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                         )._M_impl.super__Vector_impl_data >> 3,(allocator_type *)local_e0);
      lVar8 = 0;
      do {
        local_e8.p = *(LookupParameterStorage **)
                      (*(long *)&(pvVar6->
                                 super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                                 )._M_impl.super__Vector_impl_data + lVar8 * 8);
        pLVar5 = LookupParameter::get_storage(&local_e8);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e0,
                   (long)(pLVar5->values).
                         super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pLVar5->values).
                         super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6,&local_185);
        for (uVar7 = 0; pLVar5 = LookupParameter::get_storage(&local_e8),
            uVar7 < (ulong)((long)(pLVar5->values).
                                  super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pLVar5->values).
                                  super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 6);
            uVar7 = (ulong)((int)uVar7 + 1)) {
          *(undefined4 *)((long)local_e0[0] + uVar7 * 0x10 + 8) = 0;
        }
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator=
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)
                    &(local_c8.
                      super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> +
                   lVar8),(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e0)
        ;
        if (local_e0[0] != (void *)0x0) {
          operator_delete(local_e0[0]);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 7);
      std::
      vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
      ::push_back(local_178,&local_c8);
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::~vector(&local_c8);
      this = local_f8;
      if (local_48.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_f0 = local_f0 + 1;
    } while (local_f0 < this->layers);
  }
  return;
}

Assistant:

void NaryTreeLSTMBuilder::new_graph_impl(ComputationGraph& cg, bool update) {
  this->cg = &cg;
  param_vars.clear();
  lparam_vars.clear();
  param_vars.reserve(layers);
  lparam_vars.reserve(layers);

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];
    auto& lp = lparams[i];

    //i
    Expression i_x2i = update ? parameter(cg, p[X2I]) : const_parameter(cg, p[X2I]);
    Expression i_bi = update ? parameter(cg, p[BI]) : const_parameter(cg, p[BI]);
    //f
    Expression i_x2f = update ? parameter(cg, p[X2F]) : const_parameter(cg, p[X2F]);
    Expression i_bf = update ? parameter(cg, p[BF]) : const_parameter(cg, p[BF]);
    //o
    Expression i_x2o = update ? parameter(cg, p[X2O]) : const_parameter(cg, p[X2O]);
    Expression i_bo = update ? parameter(cg, p[BO]) : const_parameter(cg, p[BO]);
    //c
    Expression i_x2c = update ? parameter(cg, p[X2C]) : const_parameter(cg, p[X2C]);
    Expression i_bc = update ? parameter(cg, p[BC]) : const_parameter(cg, p[BC]);

    vector<Expression> vars = {i_x2i, i_bi, i_x2f, i_bf, i_x2o, i_bo, i_x2c, i_bc};
    param_vars.push_back(vars);

    DYNET_ASSERT(lp.size() == C2O + 1, "Dimension mismatch in TreeLSTM");
    vector<vector<Expression>> lvars(lp.size());
    for (unsigned p_type = H2I; p_type <= C2O; p_type++) {
    LookupParameter p = lp[p_type];
      vector<Expression> vals(p.get_storage().values.size());
      for (unsigned k = 0; k < p.get_storage().values.size(); ++k) {
        //vals[k] = lookup(cg, p, k);
        vals[k].i = 0;
      }
      lvars[p_type] = vals;
    }
    lparam_vars.push_back(lvars);
  }
}